

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::CopySourceCodeInfoToTest::CopySourceCodeInfoToTest
          (CopySourceCodeInfoToTest *this)

{
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CopySourceCodeInfoToTest_01607740;
  (this->collector_).super_ErrorCollector._vptr_ErrorCollector =
       (_func_int **)&PTR__ErrorCollector_01607570;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"/test/test.proto",&local_69);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"syntax = \"proto2\";\nmessage Foo {}\n",&local_6a);
  SingletonSourceTree::SingletonSourceTree(&this->source_tree_,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  compiler::SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase
            (&this->db_,&(this->source_tree_).super_SourceTree);
  DescriptorPool::DescriptorPool
            (&this->pool_,&(this->db_).super_DescriptorDatabase,
             &(this->collector_).super_ErrorCollector);
  return;
}

Assistant:

CopySourceCodeInfoToTest()
      : source_tree_("/test/test.proto", kCopySourceCodeInfoToTestInput),
        db_(&source_tree_),
        pool_(&db_, &collector_) {}